

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshalgo.c
# Opt level: O3

void psh_hint_table_done(PSH_Hint_Table table,FT_Memory memory)

{
  ft_mem_free(memory,table->zones);
  table->num_zones = 0;
  table->zones = (PSH_ZoneRec *)0x0;
  table->zone = (PSH_Zone)0x0;
  ft_mem_free(memory,table->sort);
  table->sort = (PSH_Hint_conflict *)0x0;
  ft_mem_free(memory,table->hints);
  table->sort_global = (PSH_Hint_conflict *)0x0;
  table->max_hints = 0;
  table->num_hints = 0;
  table->hints = (PSH_Hint_conflict)0x0;
  return;
}

Assistant:

static void
  psh_hint_table_done( PSH_Hint_Table  table,
                       FT_Memory       memory )
  {
    FT_FREE( table->zones );
    table->num_zones = 0;
    table->zone      = NULL;

    FT_FREE( table->sort );
    FT_FREE( table->hints );
    table->num_hints   = 0;
    table->max_hints   = 0;
    table->sort_global = NULL;
  }